

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tetgen.cxx
# Opt level: O2

bool __thiscall
tetgenmesh::circumsphere
          (tetgenmesh *this,double *pa,double *pb,double *pc,double *pd,double *cent,double *radius)

{
  bool bVar1;
  double dVar2;
  double local_f8;
  double dStack_f0;
  double local_e8;
  double local_d8;
  undefined8 uStack_d0;
  int indx [4];
  double D;
  double local_a8;
  double dStack_a0;
  double local_98;
  double local_88;
  double dStack_80;
  double local_78;
  double local_68;
  double local_60;
  double dStack_58;
  
  local_d8 = *pa;
  local_60 = pa[1];
  dStack_58 = pa[2];
  local_a8 = *pb - local_d8;
  local_88 = *pc - local_d8;
  dStack_a0 = pb[1] - local_60;
  dStack_80 = pc[1] - local_60;
  local_98 = pb[2] - dStack_58;
  local_78 = pc[2] - dStack_58;
  if (pd == (double *)0x0) {
    local_68 = dStack_a0 * local_78 - local_98 * dStack_80;
    local_60 = -(local_78 * local_a8 - local_98 * local_88);
    dStack_58 = dStack_80 * local_a8 - local_88 * dStack_a0;
  }
  else {
    local_68 = *pd - local_d8;
    local_60 = pd[1] - local_60;
    dStack_58 = pd[2] - dStack_58;
  }
  local_f8 = (local_98 * local_98 + local_a8 * local_a8 + dStack_a0 * dStack_a0) * 0.5;
  dStack_f0 = (local_78 * local_78 + local_88 * local_88 + dStack_80 * dStack_80) * 0.5;
  uStack_d0 = 0;
  if (pd == (double *)0x0) {
    local_e8 = 0.0;
  }
  else {
    local_e8 = (dStack_58 * dStack_58 + local_68 * local_68 + local_60 * local_60) * 0.5;
  }
  bVar1 = lu_decmp(this,(double (*) [4])&local_a8,3,indx,&D,0);
  if (bVar1) {
    lu_solve(this,(double (*) [4])&local_a8,3,indx,&local_f8,0);
    if (cent != (double *)0x0) {
      *cent = local_d8 + local_f8;
      cent[1] = pa[1] + dStack_f0;
      cent[2] = pa[2] + local_e8;
    }
    if (radius == (double *)0x0) {
      return bVar1;
    }
    dVar2 = SQRT(local_e8 * local_e8 + local_f8 * local_f8 + dStack_f0 * dStack_f0);
  }
  else {
    dVar2 = 0.0;
    if (radius == (double *)0x0) {
      return bVar1;
    }
  }
  *radius = dVar2;
  return bVar1;
}

Assistant:

bool tetgenmesh::circumsphere(REAL* pa, REAL* pb, REAL* pc, REAL* pd, 
                              REAL* cent, REAL* radius)
{
  REAL A[4][4], rhs[4], D;
  int indx[4];

  // Compute the coefficient matrix A (3x3).
  A[0][0] = pb[0] - pa[0];
  A[0][1] = pb[1] - pa[1];
  A[0][2] = pb[2] - pa[2];
  A[1][0] = pc[0] - pa[0];
  A[1][1] = pc[1] - pa[1];
  A[1][2] = pc[2] - pa[2];
  if (pd != NULL) {
    A[2][0] = pd[0] - pa[0];
    A[2][1] = pd[1] - pa[1]; 
    A[2][2] = pd[2] - pa[2];
  } else {
    cross(A[0], A[1], A[2]);
  }

  // Compute the right hand side vector b (3x1).
  rhs[0] = 0.5 * dot(A[0], A[0]);
  rhs[1] = 0.5 * dot(A[1], A[1]);
  if (pd != NULL) {
    rhs[2] = 0.5 * dot(A[2], A[2]);
  } else {
    rhs[2] = 0.0;
  }

  // Solve the 3 by 3 equations use LU decomposition with partial pivoting
  //   and backward and forward substitute..
  if (!lu_decmp(A, 3, indx, &D, 0)) {
    if (radius != (REAL *) NULL) *radius = 0.0;
    return false;
  }    
  lu_solve(A, 3, indx, rhs, 0);
  if (cent != (REAL *) NULL) {
    cent[0] = pa[0] + rhs[0];
    cent[1] = pa[1] + rhs[1];
    cent[2] = pa[2] + rhs[2];
  }
  if (radius != (REAL *) NULL) {
    *radius = sqrt(rhs[0] * rhs[0] + rhs[1] * rhs[1] + rhs[2] * rhs[2]);
  }
  return true;
}